

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDetectionResultColumn.cpp
# Opt level: O2

void __thiscall
ZXing::Pdf417::DetectionResultColumn::adjustCompleteIndicatorColumnRowNumbers
          (DetectionResultColumn *this,BarcodeMetadata *barcodeMetadata)

{
  vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  *codewords;
  Codeword *pCVar1;
  double dVar2;
  int iVar3;
  pointer pNVar4;
  int iVar5;
  Nullable<ZXing::ResultPoint> *pNVar6;
  Nullable<ZXing::ResultPoint> *pNVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  byte bVar12;
  bool *pbVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  int local_60;
  uint local_5c;
  Codeword codeword;
  
  if (this->_rowIndicator != None) {
    codewords = &this->_codewords;
    setRowNumbers(this);
    RemoveIncorrectCodewords(this->_rowIndicator == Left,codewords,barcodeMetadata);
    iVar3 = (this->_boundingBox)._minY;
    bVar16 = this->_rowIndicator == Left;
    pNVar6 = &(this->_boundingBox)._topRight;
    if (bVar16) {
      pNVar6 = &(this->_boundingBox)._topLeft;
    }
    pNVar7 = &(this->_boundingBox)._bottomLeft;
    if (!bVar16) {
      pNVar7 = &(this->_boundingBox)._bottomRight;
    }
    dVar2 = (pNVar7->m_value).super_PointF.y;
    lVar15 = (long)((int)(pNVar6->m_value).super_PointF.y - iVar3);
    lVar11 = lVar15 * 0x18 + -0x18;
    iVar10 = -1;
    local_60 = 0;
    local_5c = 1;
    iVar5 = 1;
    for (; lVar15 < (int)dVar2 - iVar3; lVar15 = lVar15 + 1) {
      pNVar4 = (codewords->
               super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pNVar4[lVar15].m_hasValue == true) {
        Nullable::operator_cast_to_Codeword(&codeword,(Nullable *)(pNVar4 + lVar15));
        if (iVar10 == -1) {
          iVar10 = barcodeMetadata->_rowCountLowerPart + barcodeMetadata->_rowCountUpperPart;
          if (codeword._rowNumber ==
              barcodeMetadata->_rowCountUpperPart + barcodeMetadata->_rowCountLowerPart + -1) {
            local_5c = 0xffffffff;
          }
          else {
            iVar10 = -1;
          }
        }
        uVar8 = codeword._rowNumber - iVar10;
        if (uVar8 == 0) {
          local_60 = local_60 + 1;
          iVar10 = codeword._rowNumber;
        }
        else if (uVar8 == local_5c) {
          if (iVar5 <= local_60) {
            iVar5 = local_60;
          }
LAB_00180d89:
          local_60 = 1;
          iVar10 = codeword._rowNumber;
        }
        else if ((((int)uVar8 < 0) || (lVar15 < (long)(ulong)uVar8)) ||
                (barcodeMetadata->_rowCountLowerPart + barcodeMetadata->_rowCountUpperPart <=
                 codeword._rowNumber)) {
          pNVar4 = (codewords->
                   super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pNVar4[lVar15].m_hasValue = false;
          pCVar1 = &pNVar4[lVar15].m_value;
          pCVar1->_startX = 0;
          pCVar1->_endX = 0;
          pCVar1->_bucket = 0;
          pCVar1->_value = 0;
          pNVar4[lVar15].m_value._rowNumber = -1;
        }
        else {
          iVar9 = iVar5 + -2;
          if (iVar5 < 3) {
            iVar9 = 1;
          }
          bVar12 = lVar15 <= (int)(uVar8 * iVar9);
          pNVar4 = (codewords->
                   super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pbVar13 = &pNVar4->m_hasValue + lVar11;
          for (lVar14 = 1; ((bVar12 & 1) == 0 && (lVar14 <= (int)(uVar8 * iVar9)));
              lVar14 = lVar14 + 1) {
            bVar12 = *pbVar13;
            pbVar13 = pbVar13 + -0x18;
          }
          if ((bVar12 & 1) == 0) goto LAB_00180d89;
          pNVar4[lVar15].m_hasValue = false;
          pCVar1 = &pNVar4[lVar15].m_value;
          pCVar1->_startX = 0;
          pCVar1->_endX = 0;
          pCVar1->_bucket = 0;
          pCVar1->_value = 0;
          pNVar4[lVar15].m_value._rowNumber = -1;
        }
      }
      lVar11 = lVar11 + 0x18;
    }
  }
  return;
}

Assistant:

void
DetectionResultColumn::adjustCompleteIndicatorColumnRowNumbers(const BarcodeMetadata& barcodeMetadata)
{
	if (!isRowIndicator()) {
		return;
	}

	auto& codewords = allCodewords();
	setRowNumbers();
	RemoveIncorrectCodewords(isLeftRowIndicator(), codewords, barcodeMetadata);
	const auto& bb = boundingBox();
	auto top = isLeftRowIndicator() ? bb.topLeft() : bb.topRight();
	auto bottom = isLeftRowIndicator() ? bb.bottomLeft() : bb.bottomRight();
	int firstRow = imageRowToCodewordIndex((int)top.value().y());
	int lastRow = imageRowToCodewordIndex((int)bottom.value().y());
	// We need to be careful using the average row height. Barcode could be skewed so that we have smaller and
	// taller rows
	//float averageRowHeight = (lastRow - firstRow) / (float)barcodeMetadata.rowCount();
	int barcodeRow = -1;
	int maxRowHeight = 1;
	int currentRowHeight = 0;
	int increment = 1;
	for (int codewordsRow = firstRow; codewordsRow < lastRow; codewordsRow++) {
		if (codewords[codewordsRow] == nullptr) {
			continue;
		}
		Codeword codeword = codewords[codewordsRow];
		if (barcodeRow == -1 && codeword.rowNumber() == barcodeMetadata.rowCount() - 1) {
			increment = -1;
			barcodeRow = barcodeMetadata.rowCount();
		}
		//      float expectedRowNumber = (codewordsRow - firstRow) / averageRowHeight;
		//      if (Math.abs(codeword.getRowNumber() - expectedRowNumber) > 2) {
		//        SimpleLog.log(LEVEL.WARNING,
		//            "Removing codeword, rowNumberSkew too high, codeword[" + codewordsRow + "]: Expected Row: " +
		//                expectedRowNumber + ", RealRow: " + codeword.getRowNumber() + ", value: " + codeword.getValue());
		//        codewords[codewordsRow] = null;
		//      }

		int rowDifference = codeword.rowNumber() - barcodeRow;

		if (rowDifference == 0) {
			currentRowHeight++;
		}
		else if (rowDifference == increment) {
			maxRowHeight = std::max(maxRowHeight, currentRowHeight);
			currentRowHeight = 1;
			barcodeRow = codeword.rowNumber();
		}
		else if (rowDifference < 0 ||
			codeword.rowNumber() >= barcodeMetadata.rowCount() ||
			rowDifference > codewordsRow) {
			codewords[codewordsRow] = nullptr;
		}
		else {
			int checkedRows;
			if (maxRowHeight > 2) {
				checkedRows = (maxRowHeight - 2) * rowDifference;
			}
			else {
				checkedRows = rowDifference;
			}
			bool closePreviousCodewordFound = checkedRows >= codewordsRow;
			for (int i = 1; i <= checkedRows && !closePreviousCodewordFound; i++) {
				// there must be (height * rowDifference) number of codewords missing. For now we assume height = 1.
				// This should hopefully get rid of most problems already.
				closePreviousCodewordFound = codewords[codewordsRow - i] != nullptr;
			}
			if (closePreviousCodewordFound) {
				codewords[codewordsRow] = nullptr;
			}
			else {
				barcodeRow = codeword.rowNumber();
				currentRowHeight = 1;
			}
		}
	}
	//return static_cast<int>(averageRowHeight + 0.5);
}